

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O1

void Statement_if(KonohaContext *kctx,KonohaStack *sfp)

{
  ktypeattr_t kVar1;
  kNameSpace *pkVar2;
  KClass *pKVar3;
  kNode *pkVar4;
  kNameSpace *pkVar5;
  kNameSpace *pkVar6;
  
  pkVar2 = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar3 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar5 = pkVar2;
  do {
    pkVar6 = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar5->importedNameSpaceList)->
             StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar5->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar3) break;
    pkVar5 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar5->packageId)->RootNodeNameSpace;
    pkVar6 = pkVar5;
  } while ((pkVar5->h).ct != pKVar3);
  pKVar3 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Statement_if",0x399,"tracing..");
  pkVar4 = (*kctx->klib->TypeCheckNodeByName)
                     (kctx,(kNode *)pkVar2,0xe000000a,pkVar6,
                      *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0);
  if (pkVar4->nodeType != 0x18) {
    pkVar4 = (*kctx->klib->TypeCheckNodeByName)(kctx,(kNode *)pkVar2,0xe000000b,pkVar6,pKVar3,8);
    if ((pkVar4 != (kNode *)0x0) && (pkVar4->nodeType != 0x18)) {
      (*kctx->klib->TypeCheckNodeByName)
                (kctx,(kNode *)pkVar2,0x26,pkVar6,
                 *(KClass **)
                  ((kctx->share->classTable).field_1.bytebuf +
                  (ulong)(pkVar4->typeAttr & 0xfffffff) * 8),8);
      if (*(int *)&pkVar2->parentNULL != 0x18) {
        kVar1 = pkVar4->typeAttr;
        *(undefined4 *)&pkVar2->parentNULL = 0xe;
        *(ktypeattr_t *)((long)&pkVar2->parentNULL + 4) = kVar1;
      }
      sfp[-4].field_0.asNode = (kNode *)pkVar2;
      (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
      return;
    }
  }
  return;
}

Assistant:

static KMETHOD Statement_if(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(stmt, ns, reqc);
	kNode *condNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_ExprPattern, ns, KClass_Boolean, 0);
	if(!kNode_IsError(condNode)) {
		kNode *thenNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_BlockPattern, ns, reqc, TypeCheckPolicy_AllowEmpty);
		if(thenNode != NULL && !kNode_IsError(thenNode)) {
			KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_else, ns, KClass_(thenNode->typeAttr), TypeCheckPolicy_AllowEmpty);
			KReturn(kNode_Type(stmt, KNode_If, thenNode->typeAttr));
		}
	}
}